

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

int __thiscall
rr::MultiSampleLineRasterizer::init(MultiSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int i_1;
  int iVar2;
  int i;
  long lVar3;
  undefined8 *in_RDX;
  float in_XMM0_Da;
  float fVar4;
  Vec4 normal4;
  Vec4 p3;
  Vec4 p1;
  Vec4 p2;
  Vec2 lineVec;
  Vector<float,_2> vec_1;
  Vec2 normal2;
  Vec4 p0;
  undefined8 *local_98;
  int local_90 [2];
  float local_88 [4];
  undefined8 *local_78;
  int aiStack_70 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [4];
  float local_48 [6];
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = *in_RDX;
  uStack_20 = in_RDX[1];
  local_98 = &local_28;
  local_90[0] = 0;
  local_90[1] = 1;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = *(float *)((long)&local_28 + (long)local_90[lVar3] * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_68 = *(undefined8 *)ctx;
  uStack_60 = *(undefined8 *)(ctx + 8);
  local_78 = &local_68;
  aiStack_70[0] = 0;
  aiStack_70[1] = 1;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  lVar3 = 0;
  do {
    local_48[lVar3] = *(float *)((long)&local_68 + (long)aiStack_70[lVar3] * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  lVar3 = 0;
  do {
    local_58[lVar3] = local_88[lVar3] - local_48[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_98 = (undefined8 *)(CONCAT44(local_58[0],local_58[1]) ^ 0x80000000);
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)&local_98 + lVar3 * 4);
    fVar4 = fVar4 + fVar1 * fVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  if (fVar4 < 0.0) {
    local_58[3] = in_XMM0_Da;
    fVar4 = sqrtf(fVar4);
    in_XMM0_Da = local_58[3];
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_30 = (undefined8 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_30 + lVar3 * 4) =
         *(float *)((long)&local_98 + lVar3 * 4) * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_98 = local_30;
  fVar4 = in_XMM0_Da * 0.5;
  local_90[0] = 0;
  local_90[1] = 0;
  local_78 = (undefined8 *)0x0;
  aiStack_70[0] = 0;
  aiStack_70[1] = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_78 + lVar3 * 4) = *(float *)((long)&local_98 + lVar3 * 4) * fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_28 = 0;
  uStack_20 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_28 + lVar3 * 4) =
         *(float *)(ctx + lVar3 * 4) + *(float *)((long)&local_78 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_68 = 0;
  uStack_60 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_68 + lVar3 * 4) = *(float *)((long)&local_98 + lVar3 * 4) * fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_78 = (undefined8 *)0x0;
  aiStack_70[0] = 0;
  aiStack_70[1] = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_78 + lVar3 * 4) =
         *(float *)(ctx + lVar3 * 4) - *(float *)((long)&local_68 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = *(float *)((long)&local_98 + lVar3 * 4) * fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_68 = 0;
  uStack_60 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_68 + lVar3 * 4) = *(float *)((long)in_RDX + lVar3 * 4) - local_88[lVar3]
    ;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar3 = 0;
  do {
    local_48[lVar3] = *(float *)((long)&local_98 + lVar3 * 4) * fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = *(float *)((long)in_RDX + lVar3 * 4) + local_48[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  TriangleRasterizer::init(&this->m_triangleRasterizer0,(EVP_PKEY_CTX *)&local_28);
  iVar2 = TriangleRasterizer::init(&this->m_triangleRasterizer1,(EVP_PKEY_CTX *)&local_68);
  return iVar2;
}

Assistant:

void MultiSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	// allow creation of single sampled rasterizer objects but do not allow using them
	DE_ASSERT(m_numSamples > 1);

	const tcu::Vec2 lineVec		= tcu::Vec2(tcu::Vec4(v1).xy()) - tcu::Vec2(tcu::Vec4(v0).xy());
	const tcu::Vec2 normal2		= tcu::normalize(tcu::Vec2(-lineVec[1], lineVec[0]));
	const tcu::Vec4 normal4		= tcu::Vec4(normal2.x(), normal2.y(), 0, 0);
	const float offset			= lineWidth / 2.0f;

	const tcu::Vec4 p0 = v0 + normal4 * offset;
	const tcu::Vec4 p1 = v0 - normal4 * offset;
	const tcu::Vec4 p2 = v1 - normal4 * offset;
	const tcu::Vec4 p3 = v1 + normal4 * offset;

	// Edge 0 -> 1 is always along the line and edge 1 -> 2 is in 90 degree angle to the line
	m_triangleRasterizer0.init(p0, p3, p2);
	m_triangleRasterizer1.init(p2, p1, p0);
}